

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O1

int blake2s_final(blake2s_state *S,void *out,size_t outlen)

{
  uint32_t *puVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  uint8_t buffer [32];
  uint32_t local_58 [10];
  
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  iVar4 = -1;
  if (((out != (void *)0x0) && (S->outlen <= outlen)) && (S->f[0] == 0)) {
    sVar3 = S->buflen;
    puVar1 = S->t;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + (uint)sVar3;
    S->t[1] = S->t[1] + (uint)CARRY4(uVar2,(uint)sVar3);
    if (S->last_node != '\0') {
      S->f[1] = 0xffffffff;
    }
    S->f[0] = 0xffffffff;
    lVar5 = 0;
    memset(S->buf + sVar3,0,0x40 - sVar3);
    blake2s_compress(S,S->buf);
    do {
      local_58[lVar5] = S->h[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    memcpy(out,local_58,outlen);
    iVar4 = 0;
    memset(local_58,0,0x20);
  }
  return iVar4;
}

Assistant:

int blake2s_final( blake2s_state *S, void *out, size_t outlen )
{
  uint8_t buffer[BLAKE2S_OUTBYTES] = {0};
  size_t i;

  if( out == NULL || outlen < S->outlen )
    return -1;

  if( blake2s_is_lastblock( S ) )
    return -1;

  blake2s_increment_counter( S, ( uint32_t )S->buflen );
  blake2s_set_lastblock( S );
  memset( S->buf + S->buflen, 0, BLAKE2S_BLOCKBYTES - S->buflen ); /* Padding */
  blake2s_compress( S, S->buf );

  for( i = 0; i < 8; ++i ) /* Output full hash to temp buffer */
    store32( buffer + sizeof( S->h[i] ) * i, S->h[i] );

  memcpy( out, buffer, outlen );
  secure_zero_memory(buffer, sizeof(buffer));
  return 0;
}